

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptNativeFloatArray::Push(ScriptContext *scriptContext,Var array,double value)

{
  uint32 index;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  JavascriptArray *arr;
  undefined4 *puVar4;
  Var value_00;
  ScriptContext *pSVar5;
  Var pvStack_48;
  uint32 n;
  Var args [2];
  JavascriptNativeFloatArray *nativeFloatArray;
  double value_local;
  Var array_local;
  ScriptContext *scriptContext_local;
  
  bVar2 = VarIs<Js::JavascriptNativeFloatArray>(array);
  if ((bVar2) &&
     (bVar2 = VirtualTableInfo<Js::JavascriptNativeFloatArray>::HasVirtualTable(array), bVar2)) {
    arr = (JavascriptArray *)UnsafeVarTo<Js::JavascriptNativeFloatArray>(array);
    bVar2 = Js::JavascriptArray::HasAnyES5ArrayInPrototypeChain(arr,true);
    if (bVar2) {
      pvStack_48 = array;
      args[0] = JavascriptNumber::ToVarNoCheck(value,scriptContext);
      pSVar5 = (ScriptContext *)
               Js::JavascriptArray::EntryPushNonJavascriptArray
                         (scriptContext,&stack0xffffffffffffffb8,2);
      return pSVar5;
    }
    iVar3 = (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x66])();
    if (iVar3 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x147b,"(!nativeFloatArray->IsCrossSiteObject())",
                                  "!nativeFloatArray->IsCrossSiteObject()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    index = (arr->super_ArrayObject).length;
    if (index != 0xffffffff) {
      SetItem((JavascriptNativeFloatArray *)arr,index,value);
      if (index + 1 != (arr->super_ArrayObject).length) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x1481,"(n == nativeFloatArray->length)",
                                    "Wrong update to the length of the native Float array");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      pSVar5 = (ScriptContext *)JavascriptNumber::ToVar(index + 1,scriptContext);
      return pSVar5;
    }
  }
  value_00 = JavascriptNumber::ToVarNoCheck(value,scriptContext);
  pSVar5 = (ScriptContext *)Js::JavascriptArray::Push(scriptContext,array,value_00);
  return pSVar5;
}

Assistant:

Var JavascriptNativeFloatArray::Push(ScriptContext * scriptContext, Var array, double value)
    {
        JIT_HELPER_REENTRANT_HEADER(Array_NativeFloatPush);
        JIT_HELPER_SAME_ATTRIBUTES(Array_NativeFloatPush, Array_VarPush);

        // Fast path for case where `array` is a same-site JavascriptNativeFloatArray
        // instance with a length less than MaxArrayLength
        if (VarIs<JavascriptNativeFloatArray>(array) &&
            VirtualTableInfo<JavascriptNativeFloatArray>::HasVirtualTable(array))
        {
            auto* nativeFloatArray = UnsafeVarTo<JavascriptNativeFloatArray>(array);
            if (JavascriptArray::HasAnyES5ArrayInPrototypeChain(nativeFloatArray, true))
            {
                Var args[2];
                args[0] = array;
                args[1] = JavascriptNumber::ToVarNoCheck(value, scriptContext);

                return EntryPushNonJavascriptArray(scriptContext, args, 2);
            }
            Assert(!nativeFloatArray->IsCrossSiteObject());
            uint32 n = nativeFloatArray->length;
            if( n < JavascriptArray::MaxArrayLength)
            {
                nativeFloatArray->SetItem(n, value);
                n++;
                AssertMsg(n == nativeFloatArray->length, "Wrong update to the length of the native Float array");
                return JavascriptNumber::ToVar(n, scriptContext);
            }
        }

        return JavascriptArray::Push(scriptContext, array, JavascriptNumber::ToVarNoCheck(value, scriptContext));

        JIT_HELPER_END(Array_NativeFloatPush);
    }